

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS
ref_layer_align_quad_advance
          (REF_GRID ref_grid,REF_CLOUD last,REF_LIST last_list,REF_CLOUD next,REF_LIST next_list)

{
  uint uVar1;
  double dVar2;
  REF_GLOB local_1e0;
  double local_1d8;
  REF_GLOB local_1d0;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rsb_1;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_CAVITY ref_cavity;
  REF_DBL uv [2];
  REF_INT local_160;
  REF_INT local_15c;
  REF_INT id;
  REF_INT type;
  REF_INT new_node;
  REF_INT closest_node;
  REF_DBL dist;
  REF_DBL xyz [3];
  REF_DBL h;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT aux_index;
  REF_DBL dot;
  REF_DBL m [6];
  REF_DBL d [12];
  REF_DBL normal [3];
  REF_GLOB local_58;
  REF_GLOB global;
  REF_INT item;
  REF_INT node;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_LIST next_list_local;
  REF_CLOUD next_local;
  REF_LIST last_list_local;
  REF_CLOUD last_local;
  REF_GRID ref_grid_local;
  
  ref_geom = (REF_GEOM)ref_grid->node;
  _item = ref_grid->geom;
  global._0_4_ = 0;
  if (last->n < 1) {
    local_1d0 = -1;
  }
  else {
    local_1d0 = *last->global;
  }
  local_58 = local_1d0;
  ref_node = (REF_NODE)next_list;
  next_list_local = (REF_LIST)next;
  next_local = (REF_CLOUD)last_list;
  last_list_local = (REF_LIST)last;
  last_local = (REF_CLOUD)ref_grid;
  do {
    if (last_list_local->n <= (int)global) {
      return 0;
    }
    uVar1 = ref_node_local((REF_NODE)ref_geom,local_58,(REF_INT *)((long)&global + 4));
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x26c
             ,"ref_layer_align_quad_advance",(ulong)uVar1,"local");
      return uVar1;
    }
    for (ref_private_macro_code_rss_1 = 0;
        ref_private_macro_code_rss_1 < *(int *)&last_list_local->value;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      d[(long)ref_private_macro_code_rss_1 + 0xb] =
           *(REF_DBL *)
            (last_list_local[1].value +
            (long)(ref_private_macro_code_rss_1 + *(int *)&last_list_local->value * (int)global) * 2
            );
    }
    uVar1 = ref_node_metric_get((REF_NODE)ref_geom,global._4_4_,&dot);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x270
             ,"ref_layer_align_quad_advance",(ulong)uVar1,"get");
      return uVar1;
    }
    uVar1 = ref_matrix_diag_m(&dot,m + 5);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x271
             ,"ref_layer_align_quad_advance",(ulong)uVar1,"eigen decomp");
      return uVar1;
    }
    uVar1 = ref_matrix_descending_eig_twod(m + 5);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x272
             ,"ref_layer_align_quad_advance",(ulong)uVar1,"2D eig sort");
      return uVar1;
    }
    local_1d8 = normal[1] * d[4] + d[0xb] * d[2] + normal[0] * d[3];
    if (local_1d8 <= 0.0) {
      local_1d8 = -local_1d8;
    }
    if (0.9848 < local_1d8) {
      dVar2 = sqrt(m[5]);
      xyz[2] = 1.0 / dVar2;
      dist = xyz[2] * d[0xb] + ref_geom->face_seg_per_rad[global._4_4_ * 0xf];
      xyz[0] = xyz[2] * normal[0] + ref_geom->face_seg_per_rad[global._4_4_ * 0xf + 1];
      xyz[1] = xyz[2] * normal[1] + ref_geom->face_seg_per_rad[global._4_4_ * 0xf + 2];
      uVar1 = ref_node_nearest_xyz((REF_NODE)ref_geom,&dist,&type,(REF_DBL *)&new_node);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x27f,"ref_layer_align_quad_advance",(ulong)uVar1,"close");
        return uVar1;
      }
      uVar1 = ref_node_next_global((REF_NODE)ref_geom,&local_58);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x280,"ref_layer_align_quad_advance",(ulong)uVar1,"global");
        return uVar1;
      }
      uVar1 = ref_cloud_store((REF_CLOUD)next_list_local,local_58,d + 0xb);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x281,"ref_layer_align_quad_advance",(ulong)uVar1,"store cloud");
        return uVar1;
      }
      uVar1 = ref_list_push((REF_LIST)ref_node,global._4_4_);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x282,"ref_layer_align_quad_advance",(ulong)uVar1,"store list");
        return uVar1;
      }
      uVar1 = ref_node_add((REF_NODE)ref_geom,local_58,&id);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x283,"ref_layer_align_quad_advance",(ulong)uVar1,"add");
        return uVar1;
      }
      ref_geom->face_seg_per_rad[id * 0xf] = dist;
      ref_geom->face_seg_per_rad[id * 0xf + 1] = xyz[0];
      ref_geom->face_seg_per_rad[id * 0xf + 2] = xyz[1];
      local_15c = 2;
      uVar1 = ref_geom_unique_id(_item,global._4_4_,2,&local_160);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x288,"ref_layer_align_quad_advance",(ulong)uVar1,"unique face id");
        return uVar1;
      }
      uVar1 = ref_geom_tuv(_item,global._4_4_,local_15c,local_160,(REF_DBL *)&ref_cavity);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x289,"ref_layer_align_quad_advance",(ulong)uVar1,"uv");
        return uVar1;
      }
      uVar1 = ref_egads_inverse_eval(_item,local_15c,local_160,&dist,(REF_DBL *)&ref_cavity);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x28a,"ref_layer_align_quad_advance",(ulong)uVar1,"inverse uv");
        return uVar1;
      }
      uVar1 = ref_geom_add(_item,id,local_15c,local_160,(REF_DBL *)&ref_cavity);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x28b,"ref_layer_align_quad_advance",(ulong)uVar1,"new geom");
        return uVar1;
      }
      uVar1 = ref_metric_interpolate_between((REF_GRID)last_local,global._4_4_,-1,id);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x28d,"ref_layer_align_quad_advance",(ulong)uVar1,"metric interp");
        return uVar1;
      }
      uVar1 = ref_cavity_create((REF_CAVITY *)&ref_private_macro_code_rss_5);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x28e,"ref_layer_align_quad_advance",(ulong)uVar1,"cav create");
        return uVar1;
      }
      uVar1 = ref_cavity_form_insert
                        (_ref_private_macro_code_rss_5,(REF_GRID)last_local,id,global._4_4_,
                         *(REF_INT *)(*(long *)&next_local->naux + (long)(int)global * 4),-1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x291,"ref_layer_align_quad_advance",(ulong)uVar1,"ball");
        return uVar1;
      }
      uVar1 = ref_cavity_enlarge_conforming(_ref_private_macro_code_rss_5);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x295,"ref_layer_align_quad_advance",(ulong)uVar1,"enlarge");
        ref_cavity_tec(_ref_private_macro_code_rss_5,"cav-fail.tec");
        ref_export_by_extension((REF_GRID)last_local,"mesh-fail.tec");
        return uVar1;
      }
      if (_ref_private_macro_code_rss_5->state == REF_CAVITY_VISIBLE) {
        uVar1 = ref_cavity_replace(_ref_private_macro_code_rss_5);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x29d,"ref_layer_align_quad_advance",(ulong)uVar1,"cav replace");
          ref_cavity_tec(_ref_private_macro_code_rss_5,"ref_layer_align_quad_cavity.tec");
          ref_export_by_extension((REF_GRID)last_local,"ref_layer_align_quad_mesh.tec");
          printf("norm %f %f %f dir %f %f %f dot %f\n",d[0xb],normal[0],normal[1],d[2],d[3],d[4],
                 normal[1] * d[4] + d[0xb] * d[2] + normal[0] * d[3]);
          printf("new %f %f %f\n",dist,xyz[0],xyz[1]);
          return uVar1;
        }
      }
      else {
        uVar1 = ref_node_remove((REF_NODE)ref_geom,id);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x29f,"ref_layer_align_quad_advance",(ulong)uVar1,"rm");
          return uVar1;
        }
        uVar1 = ref_geom_remove_all(_item,id);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x2a0,"ref_layer_align_quad_advance",(ulong)uVar1,"rm");
          return uVar1;
        }
        next_list_local->n = next_list_local->n + -1;
        ref_node->n = ref_node->n + -1;
      }
      uVar1 = ref_cavity_free(_ref_private_macro_code_rss_5);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x2a4,"ref_layer_align_quad_advance",(ulong)uVar1,"cav free");
        return uVar1;
      }
    }
    global._0_4_ = (int)global + 1;
    if (((int)global < 0) || (last_list_local->n <= (int)global)) {
      local_1e0 = -1;
    }
    else {
      local_1e0 = *(REF_GLOB *)(*(long *)(last_list_local + 1) + (long)(int)global * 8);
    }
    local_58 = local_1e0;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_layer_align_quad_advance(REF_GRID ref_grid,
                                                       REF_CLOUD last,
                                                       REF_LIST last_list,
                                                       REF_CLOUD next,
                                                       REF_LIST next_list) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT node, item;
  REF_GLOB global;

  each_ref_cloud_global(last, item, global) {
    REF_DBL normal[3];

    REF_DBL d[12], m[6];
    REF_DBL dot;
    REF_INT aux_index;
    RSS(ref_node_local(ref_node, global, &node), "local");
    each_ref_cloud_aux(last, aux_index) {
      normal[aux_index] = ref_cloud_aux(last, aux_index, item);
    }
    RSS(ref_node_metric_get(ref_node, node, m), "get");
    RSS(ref_matrix_diag_m(m, d), "eigen decomp");
    RSS(ref_matrix_descending_eig_twod(d), "2D eig sort");
    dot = ref_math_dot(normal, &(d[3]));
    if (ABS(dot) > 0.9848) { /* cos(10 degrees) */
      REF_DBL h, xyz[3], dist;
      REF_INT closest_node;
      REF_INT new_node;
      REF_INT type, id;
      REF_DBL uv[2];
      REF_CAVITY ref_cavity;
      h = 1.0 / sqrt(d[0]);
      xyz[0] = ref_node_xyz(ref_node, 0, node) + h * normal[0];
      xyz[1] = ref_node_xyz(ref_node, 1, node) + h * normal[1];
      xyz[2] = ref_node_xyz(ref_node, 2, node) + h * normal[2];
      RSS(ref_node_nearest_xyz(ref_node, xyz, &closest_node, &dist), "close");
      RSS(ref_node_next_global(ref_node, &global), "global");
      RSS(ref_cloud_store(next, global, normal), "store cloud");
      RSS(ref_list_push(next_list, node), "store list");
      RSS(ref_node_add(ref_node, global, &new_node), "add");
      ref_node_xyz(ref_node, 0, new_node) = xyz[0];
      ref_node_xyz(ref_node, 1, new_node) = xyz[1];
      ref_node_xyz(ref_node, 2, new_node) = xyz[2];
      type = REF_GEOM_FACE;
      RSS(ref_geom_unique_id(ref_geom, node, type, &id), "unique face id");
      RSS(ref_geom_tuv(ref_geom, node, type, id, uv), "uv");
      RSS(ref_egads_inverse_eval(ref_geom, type, id, xyz, uv), "inverse uv");
      RSS(ref_geom_add(ref_geom, new_node, type, id, uv), "new geom");
      RSS(ref_metric_interpolate_between(ref_grid, node, REF_EMPTY, new_node),
          "metric interp");
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      RSS(ref_cavity_form_insert(ref_cavity, ref_grid, new_node, node,
                                 ref_list_value(last_list, item), REF_EMPTY),
          "ball");
      RSB(ref_cavity_enlarge_conforming(ref_cavity), "enlarge", {
        ref_cavity_tec(ref_cavity, "cav-fail.tec");
        ref_export_by_extension(ref_grid, "mesh-fail.tec");
      });
      if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
        RSB(ref_cavity_replace(ref_cavity), "cav replace", {
          ref_cavity_tec(ref_cavity, "ref_layer_align_quad_cavity.tec");
          ref_export_by_extension(ref_grid, "ref_layer_align_quad_mesh.tec");
          printf("norm %f %f %f dir %f %f %f dot %f\n", normal[0], normal[1],
                 normal[2], d[3], d[4], d[5], ref_math_dot(normal, &(d[3])));
          printf("new %f %f %f\n", xyz[0], xyz[1], xyz[2]);
        });
      } else {
        RSS(ref_node_remove(ref_node, new_node), "rm");
        RSS(ref_geom_remove_all(ref_geom, new_node), "rm");
        ref_cloud_n(next)--;
        ref_list_n(next_list)--;
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
    }
  }

  return REF_SUCCESS;
}